

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_vec2 nk_panel_get_padding(nk_style *style,nk_panel_type type)

{
  long lVar1;
  
  if (type != NK_PANEL_TOOLTIP) {
    if (type == NK_PANEL_POPUP) {
      lVar1 = 0x1d4c;
      goto LAB_0011c45d;
    }
    if (type == NK_PANEL_CONTEXTUAL) {
      lVar1 = 0x1d5c;
      goto LAB_0011c45d;
    }
    if (type == NK_PANEL_COMBO) {
      lVar1 = 0x1d54;
      goto LAB_0011c45d;
    }
    if (type != NK_PANEL_MENU) {
      lVar1 = 0x1d3c;
      if (type == NK_PANEL_GROUP) {
        lVar1 = 0x1d44;
      }
      goto LAB_0011c45d;
    }
  }
  lVar1 = 0x1d64;
LAB_0011c45d:
  return *(nk_vec2 *)((long)style->cursors + lVar1 + -8);
}

Assistant:

NK_LIB struct nk_vec2
nk_panel_get_padding(const struct nk_style *style, enum nk_panel_type type)
{
    switch (type) {
    default:
    case NK_PANEL_WINDOW: return style->window.padding;
    case NK_PANEL_GROUP: return style->window.group_padding;
    case NK_PANEL_POPUP: return style->window.popup_padding;
    case NK_PANEL_CONTEXTUAL: return style->window.contextual_padding;
    case NK_PANEL_COMBO: return style->window.combo_padding;
    case NK_PANEL_MENU: return style->window.menu_padding;
    case NK_PANEL_TOOLTIP: return style->window.menu_padding;}
}